

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

string * __thiscall
pbrt::ParameterDictionary::GetOneString
          (string *__return_storage_ptr__,ParameterDictionary *this,string *name,string *def)

{
  ReturnType local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)def);
  lookupSingle<(pbrt::ParameterType)9>(__return_storage_ptr__,this,name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ParameterDictionary::GetOneString(const std::string &name,
                                              const std::string &def) const {
    return lookupSingle<ParameterType::String>(name, def);
}